

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char sqlite3ExprAffinity(Expr *pExpr)

{
  u8 uVar1;
  Expr *pEVar2;
  int op;
  Expr *pExpr_local;
  
  pEVar2 = sqlite3ExprSkipCollate(pExpr);
  if ((pEVar2->flags & 0x200) == 0) {
    uVar1 = pEVar2->op;
    if (uVar1 == 'w') {
      pExpr_local._7_1_ = sqlite3ExprAffinity(((pEVar2->x).pSelect)->pEList->a[0].pExpr);
    }
    else {
      if (uVar1 == 0x9d) {
        uVar1 = pEVar2->op2;
      }
      if (uVar1 == '%') {
        pExpr_local._7_1_ = sqlite3AffinityType((pEVar2->u).zToken,(u8 *)0x0);
      }
      else if (((uVar1 == 0x9a) || (uVar1 == 0x98)) && (pEVar2->pTab != (Table *)0x0)) {
        pExpr_local._7_1_ = sqlite3TableColumnAffinity(pEVar2->pTab,(int)pEVar2->iColumn);
      }
      else if (uVar1 == 0x9f) {
        pExpr_local._7_1_ =
             sqlite3ExprAffinity(((pEVar2->pLeft->x).pSelect)->pEList->a[pEVar2->iColumn].pExpr);
      }
      else {
        pExpr_local._7_1_ = pEVar2->affinity;
      }
    }
  }
  else {
    pExpr_local._7_1_ = '\0';
  }
  return pExpr_local._7_1_;
}

Assistant:

SQLITE_PRIVATE char sqlite3ExprAffinity(Expr *pExpr){
  int op;
  pExpr = sqlite3ExprSkipCollate(pExpr);
  if( pExpr->flags & EP_Generic ) return 0;
  op = pExpr->op;
  if( op==TK_SELECT ){
    assert( pExpr->flags&EP_xIsSelect );
    return sqlite3ExprAffinity(pExpr->x.pSelect->pEList->a[0].pExpr);
  }
  if( op==TK_REGISTER ) op = pExpr->op2;
#ifndef SQLITE_OMIT_CAST
  if( op==TK_CAST ){
    assert( !ExprHasProperty(pExpr, EP_IntValue) );
    return sqlite3AffinityType(pExpr->u.zToken, 0);
  }
#endif
  if( (op==TK_AGG_COLUMN || op==TK_COLUMN) && pExpr->pTab ){
    return sqlite3TableColumnAffinity(pExpr->pTab, pExpr->iColumn);
  }
  if( op==TK_SELECT_COLUMN ){
    assert( pExpr->pLeft->flags&EP_xIsSelect );
    return sqlite3ExprAffinity(
        pExpr->pLeft->x.pSelect->pEList->a[pExpr->iColumn].pExpr
    );
  }
  return pExpr->affinity;
}